

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  void *in_RSI;
  long in_RDI;
  int j;
  int i;
  int bits;
  secp256k1_scalar gnb;
  secp256k1_ge_storage adds;
  secp256k1_ge add;
  secp256k1_ge *in_stack_00000130;
  secp256k1_gej *in_stack_00000138;
  secp256k1_gej *in_stack_00000140;
  secp256k1_ge_storage *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int iVar1;
  int local_d8;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  secp256k1_scalar *in_stack_ffffffffffffff48;
  secp256k1_scalar *in_stack_ffffffffffffff50;
  
  memset(&stack0xffffffffffffff50,0,0x40);
  memcpy(in_RSI,(void *)(in_RDI + 0x28),0x80);
  secp256k1_scalar_add
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  for (iVar1 = 0; iVar1 < 0x40; iVar1 = iVar1 + 1) {
    secp256k1_scalar_get_bits((secp256k1_scalar *)&stack0xffffffffffffff30,iVar1 << 2,4);
    for (local_d8 = 0; local_d8 < 0x10; local_d8 = local_d8 + 1) {
      secp256k1_ge_storage_cmov
                ((secp256k1_ge_storage *)CONCAT44(iVar1,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,0);
    }
    secp256k1_ge_from_storage
              ((secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
    secp256k1_gej_add_ge(in_stack_00000140,in_stack_00000138,in_stack_00000130);
  }
  secp256k1_ge_clear((secp256k1_ge *)0x106268);
  secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff30);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < 64; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * 4, 4);
        for (i = 0; i < 16; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}